

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

Quaternion * AML::unit(Quaternion *rhs)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  Quaternion *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  
  auVar6 = *(undefined1 (*) [16])&rhs->field_0;
  auVar1 = *(undefined1 (*) [16])((long)&rhs->field_0 + 0x10);
  dVar2 = SQRT(auVar1._8_8_ * auVar1._8_8_ +
               auVar1._0_8_ * auVar1._0_8_ +
               auVar6._0_8_ * auVar6._0_8_ + auVar6._8_8_ * auVar6._8_8_);
  if (0.0 < dVar2) {
    uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
    auVar5._8_4_ = SUB84(dVar2,0);
    auVar5._0_8_ = dVar2;
    auVar5._12_4_ = uVar7;
    auVar5 = divpd(auVar6,auVar5);
    auVar6._8_4_ = SUB84(dVar2,0);
    auVar6._0_8_ = dVar2;
    auVar6._12_4_ = uVar7;
    auVar6 = divpd(auVar1,auVar6);
    *(undefined1 (*) [16])&in_RDI->field_0 = auVar5;
    *(undefined1 (*) [16])((long)&in_RDI->field_0 + 0x10) = auVar6;
    return in_RDI;
  }
  dVar2 = (rhs->field_0).data[0];
  dVar3 = (rhs->field_0).data[1];
  dVar4 = (rhs->field_0).data[3];
  (in_RDI->field_0).data[2] = (rhs->field_0).data[2];
  (in_RDI->field_0).data[3] = dVar4;
  (in_RDI->field_0).data[0] = dVar2;
  (in_RDI->field_0).data[1] = dVar3;
  return in_RDI;
}

Assistant:

Quaternion unit(const Quaternion& rhs)
    {
        double mag = norm(rhs);
        if (mag > 0.0)
        {
            return (Quaternion(rhs) / mag);
        }
        return Quaternion(rhs);
    }